

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

void __thiscall re2::NFA::~NFA(NFA *this)

{
  Thread *pTVar1;
  AddState *pAVar2;
  Thread *pTVar3;
  
  if (this->match_ != (char **)0x0) {
    operator_delete__(this->match_);
  }
  pTVar3 = this->free_threads_;
  while (pTVar3 != (Thread *)0x0) {
    pTVar1 = (pTVar3->field_0).next;
    if (pTVar3->capture != (char **)0x0) {
      operator_delete__(pTVar3->capture);
    }
    operator_delete(pTVar3);
    pTVar3 = pTVar1;
  }
  pAVar2 = (this->stack_).ptr_._M_t.
           super___uniq_ptr_impl<re2::NFA::AddState,_re2::PODArray<re2::NFA::AddState>::Deleter>.
           _M_t.
           super__Tuple_impl<0UL,_re2::NFA::AddState_*,_re2::PODArray<re2::NFA::AddState>::Deleter>.
           super__Head_base<0UL,_re2::NFA::AddState_*,_false>._M_head_impl;
  if (pAVar2 != (AddState *)0x0) {
    operator_delete(pAVar2);
  }
  (this->stack_).ptr_._M_t.
  super___uniq_ptr_impl<re2::NFA::AddState,_re2::PODArray<re2::NFA::AddState>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::NFA::AddState_*,_re2::PODArray<re2::NFA::AddState>::Deleter>.
  super__Head_base<0UL,_re2::NFA::AddState_*,_false>._M_head_impl = (AddState *)0x0;
  SparseArray<re2::NFA::Thread_*>::~SparseArray(&this->q1_);
  SparseArray<re2::NFA::Thread_*>::~SparseArray(&this->q0_);
  return;
}

Assistant:

NFA::~NFA() {
  delete[] match_;
  Thread* next;
  for (Thread* t = free_threads_; t; t = next) {
    next = t->next;
    delete[] t->capture;
    delete t;
  }
}